

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  byte bVar1;
  type_info *ptVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  byte extraout_AL;
  int iVar6;
  type_map<type_info_*> *types;
  internals *piVar7;
  iterator iVar8;
  PyObject *pPVar9;
  pointer __s;
  ulong uVar10;
  long lVar11;
  object *poVar12;
  type_info *ptVar13;
  long *plVar14;
  error_already_set *this_00;
  size_type *psVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  type_info *tinfo;
  allocator<char> local_b1;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_50 [8]
  ;
  PyObject *local_48;
  char *local_40;
  handle local_38;
  
  pPVar9 = (rec->scope).m_ptr;
  if (pPVar9 != (PyObject *)0x0) {
    iVar6 = PyObject_HasAttrString(pPVar9,"__dict__");
    if (iVar6 == 1) {
      local_48 = (rec->scope).m_ptr;
      local_40 = "__dict__";
      local_38.m_ptr = (PyObject *)0x0;
      bVar5 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              ::contains<char_const*const&>(local_50,&rec->name);
      bVar4 = true;
      goto LAB_00126359;
    }
  }
  bVar4 = false;
  bVar5 = false;
LAB_00126359:
  if (bVar4) {
    handle::dec_ref(&local_38);
  }
  if (bVar5 != false) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,rec->name,&local_b1);
    std::operator+(&local_90,"generic_type: cannot initialize type \"",&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._0_8_ = *plVar14;
    psVar15 = (size_type *)(plVar14 + 2);
    if ((size_type *)local_b0._0_8_ == psVar15) {
      local_b0._16_8_ = *psVar15;
      local_b0._24_8_ = plVar14[3];
      local_b0._0_8_ = local_b0 + 0x10;
    }
    else {
      local_b0._16_8_ = *psVar15;
    }
    local_b0._8_8_ = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pybind11_fail((string *)local_b0);
  }
  ptVar2 = rec->type;
  if ((rec->field_0x80 & 0x10) == 0) {
    __k = &local_90;
    local_90._M_dataplus._M_p = (pointer)ptVar2;
    piVar7 = get_internals();
  }
  else {
    local_b0._0_8_ = ptVar2;
    if (get_local_internals()::locals == '\0') {
      iVar6 = __cxa_guard_acquire(&get_local_internals()::locals);
      if (iVar6 != 0) {
        piVar7 = (internals *)operator_new(0x48);
        local_internals::local_internals((local_internals *)piVar7);
        get_local_internals()::locals = piVar7;
        __cxa_guard_release(&get_local_internals()::locals);
      }
    }
    __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
    piVar7 = get_local_internals()::locals;
  }
  iVar8 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)piVar7,(key_type *)__k);
  if ((iVar8.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar8.
                      super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,rec->name,&local_b1);
    std::operator+(&local_90,"generic_type: type \"",&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._0_8_ = *plVar14;
    psVar15 = (size_type *)(plVar14 + 2);
    if ((size_type *)local_b0._0_8_ == psVar15) {
      local_b0._16_8_ = *psVar15;
      local_b0._24_8_ = plVar14[3];
      local_b0._0_8_ = local_b0 + 0x10;
    }
    else {
      local_b0._16_8_ = *psVar15;
    }
    local_b0._8_8_ = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pybind11_fail((string *)local_b0);
  }
  pPVar9 = make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = pPVar9;
  __s = (pointer)operator_new(0x98);
  memset(__s,0,0x98);
  *(PyObject **)__s = pPVar9;
  *(type_info **)(__s + 8) = rec->type;
  *(size_t *)(__s + 0x10) = rec->type_size;
  *(size_t *)(__s + 0x18) = rec->type_align;
  *(_func_void_ptr_size_t **)(__s + 0x28) = rec->operator_new;
  sVar3 = rec->holder_size;
  local_90._M_dataplus._M_p = __s;
  log2((detail *)0x8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  *(size_t *)(__s + 0x20) = (sVar3 - 1 >> (extraout_AL & 0x3f)) + 1;
  *(_func_void_instance_ptr_void_ptr **)(__s + 0x30) = rec->init_instance;
  *(_func_void_value_and_holder_ptr **)(__s + 0x38) = rec->dealloc;
  bVar1 = __s[0x90];
  __s[0x90] = bVar1 | 3;
  __s[0x90] = (byte)rec->field_0x80 >> 1 & 0xc | bVar1 & 0xf3 | 3;
  local_b0._0_8_ = rec;
  local_b0._8_8_ = &local_90;
  local_b0._16_8_ = this;
  piVar7 = get_internals();
  initialize::anon_class_24_3_13231fe3::operator()((anon_class_24_3_13231fe3 *)local_b0,piVar7);
  uVar10 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  if ((uVar10 < 2) && ((rec->field_0x80 & 1) == 0)) {
    lVar11 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
    if (lVar11 == 1) {
      local_b0._8_8_ = (rec->bases).super_object.super_handle.m_ptr;
      local_b0._16_8_ = (generic_type *)0x0;
      local_b0._24_8_ = 0;
      poVar12 = accessor<pybind11::detail::accessor_policies::list_item>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::list_item> *)local_b0);
      ptVar13 = get_type_info((PyTypeObject *)(poVar12->super_handle).m_ptr);
      handle::dec_ref((handle *)(local_b0 + 0x18));
      if (ptVar13 == (type_info *)0x0) {
        __assert_fail("parent_tinfo != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                      ,0x5a2,"void pybind11::detail::generic_type::initialize(const type_record &)")
        ;
      }
      bVar1 = ptVar13->field_0x90;
      local_90._M_dataplus._M_p[0x90] = local_90._M_dataplus._M_p[0x90] & 0xfdU | bVar1 & 2;
      ptVar13->field_0x90 = ptVar13->field_0x90 & (bVar1 >> 1 | 0xfe);
    }
  }
  else {
    mark_parents_nonsimple(this,*(PyTypeObject **)local_90._M_dataplus._M_p);
    local_90._M_dataplus._M_p[0x90] = local_90._M_dataplus._M_p[0x90] & 0xfd;
  }
  if ((rec->field_0x80 & 0x10) != 0) {
    *(code **)(local_90._M_dataplus._M_p + 0x88) = type_caster_generic::local_load;
    pPVar9 = (this->super_object).super_handle.m_ptr;
    capsule::capsule((capsule *)local_b0,local_90._M_dataplus._M_p,(char *)0x0,
                     (PyCapsule_Destructor)0x0);
    iVar6 = PyObject_SetAttrString
                      (pPVar9,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",
                       local_b0._0_8_);
    if (iVar6 != 0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    handle::dec_ref((handle *)local_b0);
  }
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, "__dict__")
            && rec.scope.attr("__dict__").contains(rec.name)) {
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name)
                          + "\": an object with that name is already defined");
        }

        if ((rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            != nullptr) {
            pybind11_fail("generic_type: type \"" + std::string(rec.name)
                          + "\" is already registered!");
        }

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        with_internals([&](internals &internals) {
            auto tindex = std::type_index(*rec.type);
            tinfo->direct_conversions = &internals.direct_conversions[tindex];
            if (rec.module_local) {
                get_local_internals().registered_types_cpp[tindex] = tinfo;
            } else {
                internals.registered_types_cpp[tindex] = tinfo;
            }
            internals.registered_types_py[(PyTypeObject *) m_ptr] = {tinfo};
        });

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        } else if (rec.bases.size() == 1) {
            auto *parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            assert(parent_tinfo != nullptr);
            bool parent_simple_ancestors = parent_tinfo->simple_ancestors;
            tinfo->simple_ancestors = parent_simple_ancestors;
            // The parent can no longer be a simple type if it has MI and has a child
            parent_tinfo->simple_type = parent_tinfo->simple_type && parent_simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }